

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

int main(int argc,char **arg)

{
  float fVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  iterator __position;
  float *pfVar4;
  pointer piVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  double dVar10;
  ParameterObj par;
  ModelInstance **ppMVar11;
  ModelInstance *pMVar12;
  vector<float,_std::allocator<float>_> *this;
  pointer __s;
  pointer paVar13;
  pointer ppMVar14;
  ostream *poVar15;
  long *plVar16;
  long lVar17;
  ulong uVar18;
  ulong uVar19;
  int *piVar20;
  int iVar21;
  NetworkArray *pNVar22;
  undefined8 *puVar23;
  float *pfVar24;
  char *pcVar25;
  int i;
  int i_2;
  float *pfVar26;
  pointer paVar27;
  int i_1;
  float *pfVar28;
  int *piVar29;
  byte bVar30;
  float fVar31;
  undefined1 auVar32 [16];
  float fVar33;
  IO myIO;
  vector<ModelInstance_*,_std::allocator<ModelInstance_*>_> sims;
  string homotetramer_file;
  string activemoment_file;
  string dimerbinding_file;
  string states_file;
  string singleState_file;
  string homotetramermoment_file;
  string nicking_file;
  string nickingmoment_file;
  ParameterObj myparameters;
  ofstream out;
  UniformDistribution unif;
  array<std::vector<float,_std::allocator<float>_>_*,_1000UL> arr_per_sim;
  NetworkArray network;
  IO local_6109;
  double local_6108;
  double local_6100;
  vector<ModelInstance_*,_std::allocator<ModelInstance_*>_> local_60f8;
  vector<std::array<int,_36UL>,_std::allocator<std::array<int,_36UL>_>_> local_60d8;
  vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_> local_60b8;
  vector<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_> local_6098;
  vector<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_> local_6078;
  undefined1 *local_6058;
  long local_6050;
  undefined1 local_6048 [16];
  undefined1 *local_6038;
  long local_6030;
  undefined1 local_6028 [16];
  undefined1 *local_6018;
  long local_6010;
  undefined1 local_6008 [16];
  undefined1 *local_5ff8;
  long local_5ff0;
  undefined1 local_5fe8 [16];
  undefined1 *local_5fd8;
  long local_5fd0;
  undefined1 local_5fc8 [16];
  undefined1 *local_5fb8;
  long local_5fb0;
  undefined1 local_5fa8 [16];
  undefined1 *local_5f98;
  long local_5f90;
  undefined1 local_5f88 [16];
  undefined1 *local_5f78;
  long local_5f70;
  undefined1 local_5f68 [16];
  undefined4 local_5f58;
  float fStack_5f54;
  undefined8 uStack_5f50;
  vector<std::array<int,_36UL>,_std::allocator<std::array<int,_36UL>_>_> local_5f48;
  vector<ModelInstance_*,_std::allocator<ModelInstance_*>_> local_5f30;
  vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_> local_5f18;
  vector<ModelInstance_*,_std::allocator<ModelInstance_*>_> local_5f00;
  vector<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_> local_5ee8;
  vector<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_> local_5ed0;
  vector<ModelInstance_*,_std::allocator<ModelInstance_*>_> local_5eb8;
  string local_5ea0;
  string local_5e80;
  string local_5e60;
  string local_5e40;
  string local_5e20;
  string local_5e00;
  string local_5de0;
  string local_5dc0;
  undefined4 local_5da0;
  undefined4 uStack_5d9c;
  undefined4 uStack_5d98;
  undefined4 uStack_5d94;
  Substrate local_5d90;
  long local_5d88;
  filebuf local_5d80 [240];
  ios_base local_5c90 [264];
  UniformDistribution local_5b88;
  undefined8 local_3458 [1000];
  NetworkArray local_1518;
  
  bVar30 = 0;
  IO::read((IO *)&local_5da0,(int)&local_6109,(void *)(ulong)(uint)argc,(size_t)arg);
  par.L_conc = (float)uStack_5d9c;
  par.S_conc = (float)local_5da0;
  par.top = uStack_5d94;
  par.H_conc = (float)uStack_5d98;
  par.subs = local_5d90;
  NetworkArray::NetworkArray(&local_1518,par);
  local_60f8.super__Vector_base<ModelInstance_*,_std::allocator<ModelInstance_*>_>._M_impl.
  super__Vector_impl_data._M_start = (ModelInstance **)0x0;
  local_60f8.super__Vector_base<ModelInstance_*,_std::allocator<ModelInstance_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (ModelInstance **)0x0;
  local_60f8.super__Vector_base<ModelInstance_*,_std::allocator<ModelInstance_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (ModelInstance **)0x0;
  iVar21 = 1000;
  do {
    pMVar12 = (ModelInstance *)operator_new(0x1578);
    pNVar22 = &local_1518;
    puVar23 = (undefined8 *)&stack0xffffffffffff89e8;
    for (lVar17 = 0x29c; lVar17 != 0; lVar17 = lVar17 + -1) {
      *puVar23 = *(undefined8 *)(pNVar22->transitions)._M_elems[0]._M_elems;
      pNVar22 = (NetworkArray *)((long)pNVar22 + (ulong)bVar30 * -0x10 + 8);
      puVar23 = puVar23 + (ulong)bVar30 * -2 + 1;
    }
    ModelInstance::ModelInstance(pMVar12);
    local_5b88.super_Distribution._vptr_Distribution = (_func_int **)pMVar12;
    if (local_60f8.super__Vector_base<ModelInstance_*,_std::allocator<ModelInstance_*>_>._M_impl.
        super__Vector_impl_data._M_finish ==
        local_60f8.super__Vector_base<ModelInstance_*,_std::allocator<ModelInstance_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<ModelInstance*,std::allocator<ModelInstance*>>::_M_realloc_insert<ModelInstance*>
                ((vector<ModelInstance*,std::allocator<ModelInstance*>> *)&local_60f8,
                 (iterator)
                 local_60f8.super__Vector_base<ModelInstance_*,_std::allocator<ModelInstance_*>_>.
                 _M_impl.super__Vector_impl_data._M_finish,(ModelInstance **)&local_5b88);
    }
    else {
      *local_60f8.super__Vector_base<ModelInstance_*,_std::allocator<ModelInstance_*>_>._M_impl.
       super__Vector_impl_data._M_finish = pMVar12;
      local_60f8.super__Vector_base<ModelInstance_*,_std::allocator<ModelInstance_*>_>._M_impl.
      super__Vector_impl_data._M_finish =
           local_60f8.super__Vector_base<ModelInstance_*,_std::allocator<ModelInstance_*>_>._M_impl.
           super__Vector_impl_data._M_finish + 1;
    }
    iVar21 = iVar21 + -1;
  } while (iVar21 != 0);
  if (local_60f8.super__Vector_base<ModelInstance_*,_std::allocator<ModelInstance_*>_>._M_impl.
      super__Vector_impl_data._M_finish ==
      local_60f8.super__Vector_base<ModelInstance_*,_std::allocator<ModelInstance_*>_>._M_impl.
      super__Vector_impl_data._M_start) {
    std::__throw_out_of_range_fmt
              ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",0,0);
  }
  pMVar12 = *local_60f8.super__Vector_base<ModelInstance_*,_std::allocator<ModelInstance_*>_>.
             _M_impl.super__Vector_impl_data._M_start;
  local_6108 = (double)CONCAT44(local_6108._4_4_,pMVar12->totaltime);
  uVar2 = pMVar12->dt_diff;
  uVar3 = pMVar12->dt_react;
  uStack_5f50 = 0;
  local_5f58 = uVar2;
  fStack_5f54 = (float)uVar3;
  UniformDistribution::UniformDistribution(&local_5b88,0.0,1.0);
  lVar17 = 0;
  memset(local_3458,0,8000);
  local_6100 = (double)local_6108._0_4_;
  auVar32._4_4_ = fStack_5f54;
  auVar32._0_4_ = local_5f58;
  auVar32._8_8_ = uStack_5f50;
  auVar32 = divps(ZEXT816(0x3f80000040000000),auVar32);
  local_6108 = (double)(auVar32._4_4_ + auVar32._0_4_) * (local_6100 + 30.0);
  do {
    this = (vector<float,_std::allocator<float>_> *)operator_new(0x18);
    (this->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    (this->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    (this->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    if (0.0 < local_6108) {
      iVar21 = 1;
      do {
        fVar31 = UniformDistribution::getRandomNumber(&local_5b88);
        local_5d88 = CONCAT44(local_5d88._4_4_,fVar31);
        __position._M_current =
             (this->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
             super__Vector_impl_data._M_finish;
        if (__position._M_current ==
            (this->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<float,_std::allocator<float>_>::_M_realloc_insert<float>
                    (this,__position,(float *)&local_5d88);
        }
        else {
          *__position._M_current = fVar31;
          (this->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data.
          _M_finish = __position._M_current + 1;
        }
        dVar10 = (double)iVar21;
        iVar21 = iVar21 + 1;
      } while (dVar10 < local_6108);
    }
    *(vector<float,_std::allocator<float>_> **)((long)local_3458 + lVar17) = this;
    lVar17 = lVar17 + 8;
  } while (lVar17 != 8000);
  uVar19 = 0;
  do {
    if ((ulong)((long)local_60f8.
                      super__Vector_base<ModelInstance_*,_std::allocator<ModelInstance_*>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)local_60f8.
                      super__Vector_base<ModelInstance_*,_std::allocator<ModelInstance_*>_>._M_impl.
                      super__Vector_impl_data._M_start >> 3) <= uVar19) {
      std::__throw_out_of_range_fmt
                ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar19)
      ;
    }
    ModelInstance::main(local_60f8.
                        super__Vector_base<ModelInstance_*,_std::allocator<ModelInstance_*>_>.
                        _M_impl.super__Vector_impl_data._M_start[uVar19],
                        (vector<float,_std::allocator<float>_> *)local_3458[uVar19]);
    uVar19 = uVar19 + 1;
  } while (uVar19 != 1000);
  local_6078.super__Vector_base<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_6078.super__Vector_base<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_6078.super__Vector_base<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_6078.super__Vector_base<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)operator_new(48000);
  local_6078.super__Vector_base<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>.
  _M_impl.super__Vector_impl_data._M_finish =
       local_6078.
       super__Vector_base<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>._M_impl.
       super__Vector_impl_data._M_start + 3000;
  lVar17 = 0;
  do {
    puVar23 = (undefined8 *)
              ((long)(local_6078.
                      super__Vector_base<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>
                      ._M_impl.super__Vector_impl_data._M_start)->_M_elems + lVar17);
    *puVar23 = 0;
    puVar23[1] = 0;
    lVar17 = lVar17 + 0x10;
  } while (lVar17 != 48000);
  if (local_60f8.super__Vector_base<ModelInstance_*,_std::allocator<ModelInstance_*>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_60f8.super__Vector_base<ModelInstance_*,_std::allocator<ModelInstance_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    ppMVar14 = local_60f8.super__Vector_base<ModelInstance_*,_std::allocator<ModelInstance_*>_>.
               _M_impl.super__Vector_impl_data._M_start;
    do {
      pMVar12 = *ppMVar14;
      lVar17 = 0;
      pfVar24 = (local_6078.
                 super__Vector_base<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>
                 ._M_impl.super__Vector_impl_data._M_start)->_M_elems + 3;
      do {
        fVar31 = pMVar12->nick1;
        fVar1 = pMVar12->nick2;
        fVar33 = (float)(int)lVar17 * 0.1;
        bVar6 = fVar31 <= 0.0;
        bVar7 = fVar33 <= fVar31;
        bVar8 = fVar1 <= 0.0;
        bVar9 = fVar33 <= fVar1;
        if ((bVar7 || bVar6) && (bVar9 || bVar8)) {
          ((array<float,_4UL> *)(pfVar24 + -3))->_M_elems[0] =
               ((array<float,_4UL> *)(pfVar24 + -3))->_M_elems[0] + 0.001;
        }
        if ((!bVar7 && !bVar6) && (bVar9 || bVar8)) {
          pfVar24[-2] = pfVar24[-2] + 0.001;
        }
        if ((bVar7 || bVar6) && (!bVar9 && !bVar8)) {
          pfVar24[-1] = pfVar24[-1] + 0.001;
        }
        if ((!bVar7 && !bVar6) && (!bVar9 && !bVar8)) {
          *pfVar24 = *pfVar24 + 0.001;
        }
        lVar17 = lVar17 + 1;
        pfVar24 = pfVar24 + 4;
      } while (lVar17 != 3000);
      ppMVar14 = ppMVar14 + 1;
    } while (ppMVar14 !=
             local_60f8.super__Vector_base<ModelInstance_*,_std::allocator<ModelInstance_*>_>.
             _M_impl.super__Vector_impl_data._M_finish);
  }
  local_6098.super__Vector_base<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_6098.super__Vector_base<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_6098.super__Vector_base<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_6078.super__Vector_base<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage =
       local_6078.
       super__Vector_base<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_6098.super__Vector_base<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)operator_new(48000);
  local_6098.super__Vector_base<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_>.
  _M_impl.super__Vector_impl_data._M_finish =
       (pointer)((long)local_6098.
                       super__Vector_base<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_>
                       ._M_impl.super__Vector_impl_data._M_start + 48000);
  lVar17 = 0;
  do {
    *(undefined8 *)
     ((long)local_6098.
            super__Vector_base<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_>._M_impl
            .super__Vector_impl_data._M_start + lVar17) = 0;
    ((undefined8 *)
    ((long)local_6098.
           super__Vector_base<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_>._M_impl.
           super__Vector_impl_data._M_start + lVar17))[1] = 0;
    lVar17 = lVar17 + 0x10;
    ppMVar11 = local_60f8.super__Vector_base<ModelInstance_*,_std::allocator<ModelInstance_*>_>.
               _M_impl.super__Vector_impl_data._M_start;
  } while (lVar17 != 48000);
  for (; ppMVar11 !=
         local_60f8.super__Vector_base<ModelInstance_*,_std::allocator<ModelInstance_*>_>._M_impl.
         super__Vector_impl_data._M_finish; ppMVar11 = ppMVar11 + 1) {
    pMVar12 = *ppMVar11;
    pfVar24 = (pMVar12->dimersactive)._M_elems[0].super__Vector_base<float,_std::allocator<float>_>.
              _M_impl.super__Vector_impl_data._M_start;
    pfVar4 = (pMVar12->dimersactive)._M_elems[0].super__Vector_base<float,_std::allocator<float>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    pfVar26 = (pMVar12->dimersactive)._M_elems[1].super__Vector_base<float,_std::allocator<float>_>.
              _M_impl.super__Vector_impl_data._M_start;
    pfVar28 = (pMVar12->dimersactive)._M_elems[1].super__Vector_base<float,_std::allocator<float>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    lVar17 = 0;
    bVar6 = false;
    bVar7 = false;
    piVar20 = (int *)local_6098.
                     super__Vector_base<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
    do {
      iVar21 = (int)lVar17;
      if ((pfVar24 == pfVar4) || ((float)iVar21 * 0.1 < *pfVar24)) {
        if ((bVar6) &&
           (pMVar12->currenttime <= (float)iVar21 * 0.1 &&
            (float)iVar21 * 0.1 != pMVar12->currenttime)) {
          bVar6 = false;
        }
      }
      else {
        bVar6 = (bool)(bVar6 ^ 1);
        pfVar24 = pfVar24 + 1;
      }
      if ((pfVar26 == pfVar28) || ((float)iVar21 * 0.1 < *pfVar26)) {
        if ((bVar7) &&
           (pMVar12->currenttime <= (float)iVar21 * 0.1 &&
            (float)iVar21 * 0.1 != pMVar12->currenttime)) {
          bVar7 = false;
        }
      }
      else {
        bVar7 = (bool)(bVar7 ^ 1);
        pfVar26 = pfVar26 + 1;
      }
      if (bVar6) {
        if (bVar7) {
          piVar29 = ((pointer)
                    ((long)local_6098.
                           super__Vector_base<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_>
                           ._M_impl.super__Vector_impl_data._M_start + lVar17 * 4 * 4))->_M_elems +
                    3;
        }
        else {
          piVar29 = (int *)((long)local_6098.
                                  super__Vector_base<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start + (lVar17 * 4U + 1) * 4)
          ;
        }
      }
      else {
        piVar29 = piVar20;
        if (bVar7) {
          piVar29 = (int *)((long)local_6098.
                                  super__Vector_base<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start + (lVar17 * 4U + 2) * 4)
          ;
        }
      }
      *piVar29 = *piVar29 + 1;
      lVar17 = lVar17 + 1;
      piVar20 = piVar20 + 4;
    } while (lVar17 != 3000);
  }
  local_60b8.super__Vector_base<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_60b8.super__Vector_base<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_60b8.super__Vector_base<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_6098.super__Vector_base<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage =
       local_6098.super__Vector_base<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  __s = (pointer)operator_new(24000);
  local_60b8.super__Vector_base<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>.
  _M_impl.super__Vector_impl_data._M_start = __s;
  local_60b8.super__Vector_base<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = __s + 3000;
  memset(__s,0,24000);
  if (local_60f8.super__Vector_base<ModelInstance_*,_std::allocator<ModelInstance_*>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_60f8.super__Vector_base<ModelInstance_*,_std::allocator<ModelInstance_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    ppMVar14 = local_60f8.super__Vector_base<ModelInstance_*,_std::allocator<ModelInstance_*>_>.
               _M_impl.super__Vector_impl_data._M_start;
    do {
      pMVar12 = *ppMVar14;
      pfVar24 = (pMVar12->homotetramer).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_start;
      pfVar4 = (pMVar12->homotetramer).super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_finish;
      lVar17 = 0;
      bVar6 = false;
      pfVar26 = __s->_M_elems + 1;
      do {
        if ((pfVar24 == pfVar4) || ((float)(int)lVar17 * 0.1 < *pfVar24)) {
          if (!bVar6) goto LAB_00102c54;
LAB_00102c41:
          bVar6 = true;
          pfVar28 = __s[lVar17]._M_elems;
LAB_00102c73:
          *pfVar28 = *pfVar28 + 1.0;
        }
        else {
          pfVar24 = pfVar24 + 1;
          if (!bVar6) goto LAB_00102c41;
LAB_00102c54:
          bVar6 = false;
          pfVar28 = pfVar26;
          if ((float)(int)lVar17 * 0.1 <= pMVar12->currenttime) goto LAB_00102c73;
        }
        lVar17 = lVar17 + 1;
        pfVar26 = pfVar26 + 2;
      } while (lVar17 != 3000);
      ppMVar14 = ppMVar14 + 1;
    } while (ppMVar14 !=
             local_60f8.super__Vector_base<ModelInstance_*,_std::allocator<ModelInstance_*>_>.
             _M_impl.super__Vector_impl_data._M_finish);
  }
  local_60d8.super__Vector_base<std::array<int,_36UL>,_std::allocator<std::array<int,_36UL>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_60d8.super__Vector_base<std::array<int,_36UL>,_std::allocator<std::array<int,_36UL>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_60d8.super__Vector_base<std::array<int,_36UL>,_std::allocator<std::array<int,_36UL>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_60b8.super__Vector_base<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = __s + 3000;
  paVar13 = (pointer)operator_new(0x69780);
  paVar27 = paVar13 + 3000;
  lVar17 = 0;
  local_60d8.super__Vector_base<std::array<int,_36UL>,_std::allocator<std::array<int,_36UL>_>_>.
  _M_impl.super__Vector_impl_data._M_start = paVar13;
  local_60d8.super__Vector_base<std::array<int,_36UL>,_std::allocator<std::array<int,_36UL>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = paVar27;
  do {
    memset((void *)((long)paVar13->_M_elems + lVar17),0,0x90);
    lVar17 = lVar17 + 0x90;
  } while (lVar17 != 0x69780);
  local_60d8.super__Vector_base<std::array<int,_36UL>,_std::allocator<std::array<int,_36UL>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = paVar27;
  if (local_60f8.super__Vector_base<ModelInstance_*,_std::allocator<ModelInstance_*>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_60f8.super__Vector_base<ModelInstance_*,_std::allocator<ModelInstance_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    pcVar25 = "array::at: __n (which is %zu) >= _Nm (which is %zu)";
    ppMVar14 = local_60f8.super__Vector_base<ModelInstance_*,_std::allocator<ModelInstance_*>_>.
               _M_impl.super__Vector_impl_data._M_start;
    do {
      pMVar12 = *ppMVar14;
      iVar21 = 1;
      lVar17 = 0;
      paVar27 = paVar13;
      do {
        if (iVar21 < 1) {
          uVar19 = (ulong)iVar21;
        }
        else {
          uVar19 = (ulong)(int)(((float)(int)lVar17 * 0.1) / fStack_5f54);
          piVar5 = (pMVar12->states).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
          uVar18 = (long)(pMVar12->states).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_finish - (long)piVar5 >> 2;
          if (uVar18 <= uVar19) {
            pcVar25 = "vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)";
LAB_001039bc:
            std::__throw_out_of_range_fmt(pcVar25,uVar19,uVar18);
          }
          iVar21 = piVar5[uVar19];
          uVar19 = (ulong)iVar21;
          if (0x23 < uVar19) {
            uVar18 = 0x24;
            goto LAB_001039bc;
          }
        }
        paVar27->_M_elems[uVar19] = paVar27->_M_elems[uVar19] + 1;
        lVar17 = lVar17 + 1;
        paVar27 = paVar27 + 1;
      } while (lVar17 != 3000);
      ppMVar14 = ppMVar14 + 1;
    } while (ppMVar14 !=
             local_60f8.super__Vector_base<ModelInstance_*,_std::allocator<ModelInstance_*>_>.
             _M_impl.super__Vector_impl_data._M_finish);
  }
  std::ofstream::ofstream(&local_5d88);
  local_5f78 = local_5f68;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_5f78,"nicking_moments.tsv","");
  std::ofstream::open((string *)&local_5d88,(_Ios_Openmode)&local_5f78);
  poVar15 = std::ostream::_M_insert<double>(local_6100);
  std::__ostream_insert<char,std::char_traits<char>>(poVar15,"\t",1);
  poVar15 = std::ostream::_M_insert<double>(0.10000000149011612);
  std::__ostream_insert<char,std::char_traits<char>>(poVar15,"\t",1);
  plVar16 = (long *)std::ostream::operator<<(poVar15,1000);
  std::ios::widen((char)*(undefined8 *)(*plVar16 + -0x18) + (char)plVar16);
  std::ostream::put((char)plVar16);
  std::ostream::flush();
  std::ofstream::close();
  std::vector<ModelInstance_*,_std::allocator<ModelInstance_*>_>::vector(&local_5eb8,&local_60f8);
  local_5dc0._M_dataplus._M_p = (pointer)&local_5dc0.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_5dc0,local_5f78,local_5f78 + local_5f70);
  IO::momentsNicking(&local_6109,&local_5eb8,&local_5dc0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5dc0._M_dataplus._M_p != &local_5dc0.field_2) {
    operator_delete(local_5dc0._M_dataplus._M_p);
  }
  if (local_5eb8.super__Vector_base<ModelInstance_*,_std::allocator<ModelInstance_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_5eb8.super__Vector_base<ModelInstance_*,_std::allocator<ModelInstance_*>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  local_5f98 = local_5f88;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_5f98,"nicking.tsv","");
  std::ofstream::open((string *)&local_5d88,(_Ios_Openmode)&local_5f98);
  poVar15 = std::ostream::_M_insert<double>(local_6100);
  std::__ostream_insert<char,std::char_traits<char>>(poVar15,"\t",1);
  poVar15 = std::ostream::_M_insert<double>(0.10000000149011612);
  std::__ostream_insert<char,std::char_traits<char>>(poVar15,"\t",1);
  plVar16 = (long *)std::ostream::operator<<(poVar15,1000);
  std::ios::widen((char)*(undefined8 *)(*plVar16 + -0x18) + (char)plVar16);
  std::ostream::put((char)plVar16);
  std::ostream::flush();
  std::ofstream::close();
  std::vector<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>::vector
            (&local_5ed0,&local_6078);
  local_5de0._M_dataplus._M_p = (pointer)&local_5de0.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_5de0,local_5f98,local_5f98 + local_5f90);
  IO::writeNicking(&local_6109,&local_5ed0,&local_5de0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5de0._M_dataplus._M_p != &local_5de0.field_2) {
    operator_delete(local_5de0._M_dataplus._M_p);
  }
  if (local_5ed0.
      super__Vector_base<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_5ed0.
                    super__Vector_base<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  local_6018 = local_6008;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_6018,"dimerBinding.tsv","");
  std::ofstream::open((string *)&local_5d88,(_Ios_Openmode)&local_6018);
  poVar15 = std::ostream::_M_insert<double>(local_6100);
  std::__ostream_insert<char,std::char_traits<char>>(poVar15,"\t",1);
  poVar15 = std::ostream::_M_insert<double>(0.10000000149011612);
  std::__ostream_insert<char,std::char_traits<char>>(poVar15,"\t",1);
  plVar16 = (long *)std::ostream::operator<<(poVar15,1000);
  std::ios::widen((char)*(undefined8 *)(*plVar16 + -0x18) + (char)plVar16);
  std::ostream::put((char)plVar16);
  std::ostream::flush();
  std::ofstream::close();
  std::vector<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_>::vector
            (&local_5ee8,&local_6098);
  local_5e00._M_dataplus._M_p = (pointer)&local_5e00.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_5e00,local_6018,local_6018 + local_6010);
  IO::writeDimerActivating(&local_6109,&local_5ee8,&local_5e00);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5e00._M_dataplus._M_p != &local_5e00.field_2) {
    operator_delete(local_5e00._M_dataplus._M_p);
  }
  if (local_5ee8.super__Vector_base<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_5ee8.
                    super__Vector_base<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  local_6038 = local_6028;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_6038,"dimerBinding_moments.tsv","");
  std::ofstream::open((string *)&local_5d88,(_Ios_Openmode)&local_6038);
  poVar15 = std::ostream::_M_insert<double>(local_6100);
  std::__ostream_insert<char,std::char_traits<char>>(poVar15,"\t",1);
  poVar15 = std::ostream::_M_insert<double>(0.10000000149011612);
  std::__ostream_insert<char,std::char_traits<char>>(poVar15,"\t",1);
  plVar16 = (long *)std::ostream::operator<<(poVar15,1000);
  std::ios::widen((char)*(undefined8 *)(*plVar16 + -0x18) + (char)plVar16);
  std::ostream::put((char)plVar16);
  std::ostream::flush();
  std::ofstream::close();
  std::vector<ModelInstance_*,_std::allocator<ModelInstance_*>_>::vector(&local_5f00,&local_60f8);
  local_5e20._M_dataplus._M_p = (pointer)&local_5e20.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_5e20,local_6038,local_6038 + local_6030);
  IO::momentsActive(&local_6109,&local_5f00,&local_5e20);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5e20._M_dataplus._M_p != &local_5e20.field_2) {
    operator_delete(local_5e20._M_dataplus._M_p);
  }
  if (local_5f00.super__Vector_base<ModelInstance_*,_std::allocator<ModelInstance_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_5f00.super__Vector_base<ModelInstance_*,_std::allocator<ModelInstance_*>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  local_6058 = local_6048;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_6058,"homotetramers.tsv","");
  std::ofstream::open((string *)&local_5d88,(_Ios_Openmode)&local_6058);
  poVar15 = std::ostream::_M_insert<double>(local_6100);
  std::__ostream_insert<char,std::char_traits<char>>(poVar15,"\t",1);
  poVar15 = std::ostream::_M_insert<double>(0.10000000149011612);
  std::__ostream_insert<char,std::char_traits<char>>(poVar15,"\t",1);
  plVar16 = (long *)std::ostream::operator<<(poVar15,1000);
  std::ios::widen((char)*(undefined8 *)(*plVar16 + -0x18) + (char)plVar16);
  std::ostream::put((char)plVar16);
  std::ostream::flush();
  std::ofstream::close();
  std::vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>::vector
            (&local_5f18,&local_60b8);
  local_5e40._M_dataplus._M_p = (pointer)&local_5e40.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_5e40,local_6058,local_6058 + local_6050);
  IO::writeHomotetramers(&local_6109,&local_5f18,&local_5e40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5e40._M_dataplus._M_p != &local_5e40.field_2) {
    operator_delete(local_5e40._M_dataplus._M_p);
  }
  if (local_5f18.
      super__Vector_base<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_5f18.
                    super__Vector_base<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  local_5fb8 = local_5fa8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_5fb8,"homotetramers_moments.tsv","");
  std::ofstream::open((string *)&local_5d88,(_Ios_Openmode)&local_5fb8);
  poVar15 = std::ostream::_M_insert<double>(local_6100);
  std::__ostream_insert<char,std::char_traits<char>>(poVar15,"\t",1);
  poVar15 = std::ostream::_M_insert<double>(0.10000000149011612);
  std::__ostream_insert<char,std::char_traits<char>>(poVar15,"\t",1);
  plVar16 = (long *)std::ostream::operator<<(poVar15,1000);
  std::ios::widen((char)*(undefined8 *)(*plVar16 + -0x18) + (char)plVar16);
  std::ostream::put((char)plVar16);
  std::ostream::flush();
  std::ofstream::close();
  std::vector<ModelInstance_*,_std::allocator<ModelInstance_*>_>::vector(&local_5f30,&local_60f8);
  local_5e60._M_dataplus._M_p = (pointer)&local_5e60.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_5e60,local_5fb8,local_5fb8 + local_5fb0);
  IO::momentsHomotetramer(&local_6109,&local_5f30,&local_5e60);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5e60._M_dataplus._M_p != &local_5e60.field_2) {
    operator_delete(local_5e60._M_dataplus._M_p);
  }
  if (local_5f30.super__Vector_base<ModelInstance_*,_std::allocator<ModelInstance_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_5f30.super__Vector_base<ModelInstance_*,_std::allocator<ModelInstance_*>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  local_5fd8 = local_5fc8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_5fd8,"statesSingle.tsv","");
  std::ofstream::open((string *)&local_5d88,(_Ios_Openmode)&local_5fd8);
  std::ofstream::close();
  if (local_60f8.super__Vector_base<ModelInstance_*,_std::allocator<ModelInstance_*>_>._M_impl.
      super__Vector_impl_data._M_finish ==
      local_60f8.super__Vector_base<ModelInstance_*,_std::allocator<ModelInstance_*>_>._M_impl.
      super__Vector_impl_data._M_start) {
    std::__throw_out_of_range_fmt
              ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",0,0);
  }
  pMVar12 = *local_60f8.super__Vector_base<ModelInstance_*,_std::allocator<ModelInstance_*>_>.
             _M_impl.super__Vector_impl_data._M_start;
  local_5e80._M_dataplus._M_p = (pointer)&local_5e80.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_5e80,local_5fd8,local_5fd8 + local_5fd0);
  IO::singleStates(&local_6109,pMVar12,&local_5e80);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5e80._M_dataplus._M_p != &local_5e80.field_2) {
    operator_delete(local_5e80._M_dataplus._M_p);
  }
  local_5ff8 = local_5fe8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_5ff8,"states.tsv","");
  std::ofstream::open((string *)&local_5d88,(_Ios_Openmode)&local_5ff8);
  poVar15 = std::ostream::_M_insert<double>(local_6100);
  std::__ostream_insert<char,std::char_traits<char>>(poVar15,"\t",1);
  poVar15 = std::ostream::_M_insert<double>(0.10000000149011612);
  std::__ostream_insert<char,std::char_traits<char>>(poVar15,"\t",1);
  plVar16 = (long *)std::ostream::operator<<(poVar15,1000);
  std::ios::widen((char)*(undefined8 *)(*plVar16 + -0x18) + (char)plVar16);
  std::ostream::put((char)plVar16);
  std::ostream::flush();
  std::ofstream::close();
  std::vector<std::array<int,_36UL>,_std::allocator<std::array<int,_36UL>_>_>::vector
            (&local_5f48,&local_60d8);
  local_5ea0._M_dataplus._M_p = (pointer)&local_5ea0.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_5ea0,local_5ff8,local_5ff8 + local_5ff0);
  IO::writeStates(&local_6109,&local_5f48,&local_5ea0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5ea0._M_dataplus._M_p != &local_5ea0.field_2) {
    operator_delete(local_5ea0._M_dataplus._M_p);
  }
  if (local_5f48.super__Vector_base<std::array<int,_36UL>,_std::allocator<std::array<int,_36UL>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_5f48.
                    super__Vector_base<std::array<int,_36UL>,_std::allocator<std::array<int,_36UL>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"finished",8);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + ' ');
  std::ostream::put(' ');
  std::ostream::flush();
  if (local_5ff8 != local_5fe8) {
    operator_delete(local_5ff8);
  }
  if (local_5fd8 != local_5fc8) {
    operator_delete(local_5fd8);
  }
  if (local_5fb8 != local_5fa8) {
    operator_delete(local_5fb8);
  }
  if (local_6058 != local_6048) {
    operator_delete(local_6058);
  }
  if (local_6038 != local_6028) {
    operator_delete(local_6038);
  }
  if (local_6018 != local_6008) {
    operator_delete(local_6018);
  }
  if (local_5f98 != local_5f88) {
    operator_delete(local_5f98);
  }
  if (local_5f78 != local_5f68) {
    operator_delete(local_5f78);
  }
  local_5d88 = _VTT;
  *(undefined8 *)(local_5d80 + *(long *)(_VTT + -0x18) + -8) = _memcpy;
  std::filebuf::~filebuf(local_5d80);
  std::ios_base::~ios_base(local_5c90);
  if (local_60d8.super__Vector_base<std::array<int,_36UL>,_std::allocator<std::array<int,_36UL>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_60d8.
                    super__Vector_base<std::array<int,_36UL>,_std::allocator<std::array<int,_36UL>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_60b8.
      super__Vector_base<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_60b8.
                    super__Vector_base<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_6098.super__Vector_base<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_6098.
                    super__Vector_base<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_6078.
      super__Vector_base<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_6078.
                    super__Vector_base<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  local_5b88.super_Distribution._vptr_Distribution = (_func_int **)&PTR___cxa_pure_virtual_0010bd00;
  std::random_device::_M_fini();
  if (local_60f8.super__Vector_base<ModelInstance_*,_std::allocator<ModelInstance_*>_>._M_impl.
      super__Vector_impl_data._M_start != (ModelInstance **)0x0) {
    operator_delete(local_60f8.super__Vector_base<ModelInstance_*,_std::allocator<ModelInstance_*>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  return 0;
}

Assistant:

int main(int argc, char ** arg) {
	IO myIO;
	ParameterObj myparameters = myIO.read(argc, arg);

	NetworkArray network(myparameters);		// Set up the network
	const int num_sims = 1000;

	std::vector<ModelInstance*> sims; // create vector of pointers to model objects
	for (int i=0; i<num_sims; i++){
		sims.push_back(new ModelInstance(network, myparameters));
	}

	float totaltime = sims.at(0)->totaltime;
	float dt_reaction = sims.at(0)->dt_react;
	float dt_diffusion = sims.at(0)->dt_diff;
	float dt_plot = 0.1;

	UniformDistribution unif(0,1);
	std::array<std::vector<float>*, num_sims> arr_per_sim{};
	for (auto & it : arr_per_sim) {
		auto *myarr_ptr = new std::vector<float>;
		for (int i = 0; i < (totaltime+30.0)*(1/dt_reaction + 2/dt_diffusion); i++) {
			myarr_ptr->push_back(unif.getRandomNumber());
		}
		it = myarr_ptr;
	}

#pragma omp parallel
	{
#pragma omp for
		for (size_t i = 0; i < num_sims; i++){
			sims.at(i)->main(arr_per_sim.at(i));
		}
	}

	const int numtimesteps = 3000;
	std::vector<std::array<float, 4>> nicking_arr(numtimesteps, std::array<float, 4>{});
	bool nicked1;
	bool nicked2;

	// Create table nicking fractions over time
	for (ModelInstance* model: sims){
		for (int i = 0; i< numtimesteps; i++) {
			nicked1 = model->nick1 >0 && model->nick1 < i*dt_plot;
			nicked2 = model->nick2 >0 && model->nick2 < i*dt_plot;
			if (!nicked1 && !nicked2){
				nicking_arr.at(i).at(0) += 1.0 / num_sims;
			}
			if (nicked1 && !nicked2){
				nicking_arr.at(i).at(1) += 1.0 / num_sims;
			}
			if (!nicked1 && nicked2){
				nicking_arr.at(i).at(2) += 1.0 / num_sims;
			}
			if (nicked1 && nicked2){
				nicking_arr.at(i).at(3) += 1.0 / num_sims;
			}
		}
	}

	// Create table activations over time
	bool first_bound;
	bool second_bound;
	std::vector<std::array<int, 4>> boundarr(numtimesteps, std::array<int, 4>{});
	for (ModelInstance* model: sims){
		first_bound = false;
		second_bound = false;
		auto it1 = model->dimersactive.at(0).begin();
		auto it2 = model->dimersactive.at(1).begin();
		for (int i = 0; i< numtimesteps; i++) {
			if (it1 != model->dimersactive.at(0).end() && *it1 <= i * dt_plot){
				first_bound = !first_bound;
				it1++;
			}
			else if(first_bound && model->currenttime < i * dt_plot){
				first_bound = false;
			}
			if (it2 != model->dimersactive.at(1).end() && *it2 <= i * dt_plot){
				second_bound = !second_bound;
				it2++;
			}
			else if(second_bound && model->currenttime < i * dt_plot){
				second_bound = false;
			}
			if (!first_bound && !second_bound){
				boundarr.at(i).at(0) += 1;
			}
			if (first_bound && !second_bound){
				boundarr.at(i).at(1) += 1;
			}
			if (!first_bound && second_bound){
				boundarr.at(i).at(2) += 1;
			}
			if (first_bound && second_bound){
				boundarr.at(i).at(3) += 1;
			}
		}
	}

	// Create table homo/heterodimers over time
	bool ishomotetramer;
	std::vector<std::array<float,2>> homotetramer_arr(numtimesteps, std::array<float, 2>{});
	for(ModelInstance * model: sims){
		ishomotetramer = false;
		auto it1 = model->homotetramer.begin();
		for (int i = 0; i< numtimesteps; i++) {
			if (it1 != model->homotetramer.end() && *it1 <= i * dt_plot){
				ishomotetramer = !ishomotetramer;
				it1++;
			}
			if(ishomotetramer){
				homotetramer_arr.at(i).at(0) += 1;
			}
			else if(model->currenttime >= i * dt_plot){
				homotetramer_arr.at(i).at(1) += 1;
			}
		}
	}

	// Create table states over tine
	std::vector<std::array<int, 36>> states_arr(numtimesteps, std::array<int, 36>{});
	int index_statesvector;
	int currentstate;
	for (ModelInstance * model: sims) {
		currentstate = 1;
		for (int i=0; i<numtimesteps; i++){
			index_statesvector = float(i)*dt_plot/dt_reaction;
			if (currentstate > 0) {
				currentstate = model->states.at(index_statesvector);
			}
			states_arr.at(i).at(currentstate) += 1;
		}
	}

	std::ofstream out;

	// Save nicking moments
	std::string nickingmoment_file = "nicking_moments.tsv";
	out.open(nickingmoment_file);
	out << totaltime << "\t" << dt_plot << "\t" << num_sims << std::endl;
	out.close();
	myIO.momentsNicking(sims, nickingmoment_file);

	// Save nicking fractions over time
	std::string nicking_file = "nicking.tsv";
	out.open(nicking_file);
	out << totaltime << "\t" << dt_plot << "\t" << num_sims << std::endl;
	out.close();
	myIO.writeNicking(nicking_arr, nicking_file);

	// Save active dimers over time
	std::string dimerbinding_file = "dimerBinding.tsv";
	out.open(dimerbinding_file);
	out << totaltime << "\t" << dt_plot << "\t" << num_sims << std::endl;
	out.close();
	myIO.writeDimerActivating(boundarr, dimerbinding_file);

	// Save binding/unbinding moments
	std::string activemoment_file = "dimerBinding_moments.tsv";
	out.open(activemoment_file);
	out << totaltime << "\t" << dt_plot << "\t" << num_sims << std::endl;
	out.close();
	myIO.momentsActive(sims, activemoment_file);

	// Save homo/heterotetramers over time
	std::string homotetramer_file = "homotetramers.tsv";
	out.open(homotetramer_file);
	out << totaltime << "\t" << dt_plot << "\t" << num_sims << std::endl;
	out.close();
	myIO.writeHomotetramers(homotetramer_arr, homotetramer_file);

	// Save homotetramer moments
	std::string homotetramermoment_file = "homotetramers_moments.tsv";
	out.open(homotetramermoment_file);
	out << totaltime << "\t" << dt_plot << "\t" << num_sims << std::endl;
	out.close();
	myIO.momentsHomotetramer(sims, homotetramermoment_file);

	std::string singleState_file = "statesSingle.tsv";
	out.open(singleState_file);
	out.close();
	myIO.singleStates(sims.at(0), singleState_file);

	std::string states_file = "states.tsv";
	out.open(states_file);
	out << totaltime << "\t" << dt_plot << "\t" << num_sims << std::endl;
	out.close();
	myIO.writeStates(states_arr, states_file);

	std::cout << "finished" << std::endl;
	return 0;
}